

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTestPackages.cpp
# Opt level: O0

int __thiscall gl3cts::GL30TestPackage::init(GL30TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  Context *pCVar2;
  GL30TestPackage *this_local;
  
  deqp::TestPackage::init(&this->super_TestPackage,ctx);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext(&this->super_TestPackage);
  deqp::InfoTests::InfoTests((InfoTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext(&this->super_TestPackage);
  ClipDistance::Tests::Tests((Tests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext(&this->super_TestPackage);
  GPUShader5Tests::GPUShader5Tests((GPUShader5Tests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext(&this->super_TestPackage);
  GLSLnoperspectiveTests::GLSLnoperspectiveTests((GLSLnoperspectiveTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext(&this->super_TestPackage);
  TransformFeedback::Tests::Tests((Tests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void GL30TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	TestPackage::init();

	try
	{
		addChild(new deqp::InfoTests(getContext()));
		addChild(new gl3cts::ClipDistance::Tests(getContext()));
		addChild(new gl3cts::GPUShader5Tests(getContext()));
		addChild(new gl3cts::GLSLnoperspectiveTests(getContext()));
		addChild(new gl3cts::TransformFeedback::Tests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}